

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

double __thiscall VCClusterAnisoQuad::energyWithItem(VCClusterAnisoQuad *this,VCFace *f)

{
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  ReturnType RVar1;
  Vector3d zi;
  Matrix4d Eo;
  Vector3d sKP;
  Matrix3d sK;
  MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
  *in_stack_fffffffffffffe48;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe50;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffe58;
  MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_fffffffffffffe60;
  MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_fffffffffffffe68;
  Matrix4d *in_stack_fffffffffffffe70;
  VCClusterAnisoQuad *in_stack_fffffffffffffe78;
  
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffe68,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffe60);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffe60,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffffe58);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffe68,
             (MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
              *)in_stack_fffffffffffffe60);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffe60,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>_>
              *)in_stack_fffffffffffffe58);
  Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator+
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,4,4,0,4,4>const,Eigen::Matrix<double,4,4,0,4,4>const>>
            ((Matrix<double,_4,_4,_0,_4,_4> *)in_stack_fffffffffffffe60,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)in_stack_fffffffffffffe58);
  center(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,(Matrix3d *)in_stack_fffffffffffffe68,
         (Vector3d *)in_stack_fffffffffffffe60);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
          dot<Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>>
                    (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (in_stack_fffffffffffffe50,other);
  return (double)other - (RVar1 + RVar1);
}

Assistant:

double VCClusterAnisoQuad::energyWithItem(VCFace* f) {
	Matrix3d sK = sumK + f->K;
	Vector3d sKP = sumKPos + f->K * f->center;
	Matrix4d Eo = E + f->E;
	Vector3d zi = center(Eo, sK, sKP);
	return zi.dot(sK * zi) - 2 * zi.dot(sKP);
}